

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O2

Opnd * __thiscall
GlobOpt::CopyProp(GlobOpt *this,Opnd *opnd,Instr *instr,Value *val,IndirOpnd *parentIndirOpnd)

{
  OpCode OVar1;
  int iVar2;
  ValueInfo *this_00;
  Opnd *this_01;
  code *pcVar3;
  bool bVar4;
  uint uVar5;
  uint uVar6;
  IndirOpnd *pIVar7;
  undefined4 *puVar8;
  JITTimeFunctionBody *pJVar9;
  Int64ConstOpnd *this_02;
  int64 iVar10;
  AddrOpnd *this_03;
  StackSym *pSVar11;
  Var pvVar12;
  Opnd *pOVar13;
  RegOpnd *pRVar14;
  SymOpnd *pSVar15;
  StackSym *pSVar16;
  IRType IVar17;
  uint uVar18;
  ulong value;
  int i;
  long lVar19;
  Instr *pIVar20;
  anon_union_2_4_ea848c7b_for_ValueType_13 aaStack_68 [2];
  undefined4 uStack_64;
  int64 int64ConstantValue;
  Opnd *local_58;
  undefined4 *local_50;
  StackSym *local_48;
  Instr *local_40;
  uint local_34 [2];
  int32 intConstantValue;
  
  if (parentIndirOpnd == (IndirOpnd *)0x0) {
    if (((instr->m_src1 != opnd) && (instr->m_src2 != opnd)) &&
       ((instr->m_dst != opnd || (bVar4 = IR::Opnd::IsIndirOpnd(opnd), !bVar4)))) goto LAB_0042b51b;
  }
  else if ((parentIndirOpnd->m_baseOpnd != (RegOpnd *)opnd) &&
          (parentIndirOpnd->m_indexOpnd != (RegOpnd *)opnd)) {
LAB_0042b51b:
    AssertCount = AssertCount + 1;
    local_48 = (StackSym *)parentIndirOpnd;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar8 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0xe8d,
                       "(parentIndirOpnd ? opnd == parentIndirOpnd->GetBaseOpnd() || opnd == parentIndirOpnd->GetIndexOpnd() : opnd == instr->GetSrc1() || opnd == instr->GetSrc2() || opnd == instr->GetDst() && opnd->IsIndirOpnd())"
                       ,
                       "parentIndirOpnd ? opnd == parentIndirOpnd->GetBaseOpnd() || opnd == parentIndirOpnd->GetIndexOpnd() : opnd == instr->GetSrc1() || opnd == instr->GetSrc2() || opnd == instr->GetDst() && opnd->IsIndirOpnd()"
                      );
    if (!bVar4) goto LAB_0042c0f6;
    *puVar8 = 0;
    parentIndirOpnd = (IndirOpnd *)local_48;
  }
  if (this->prePassLoop != (Loop *)0x0) {
    return opnd;
  }
  OVar1 = instr->m_opcode;
  if (OVar1 == CheckFixedFld) {
    return opnd;
  }
  if (OVar1 == CheckPropertyGuardAndLoadType) {
    return opnd;
  }
  if ((OVar1 == ExtendArg_A) && (instr->m_src2 == opnd)) {
    return opnd;
  }
  if (((((((ushort)(OVar1 - Simd128_IntsToI4) < 0x14 ||
           (ushort)(OVar1 - Simd128_BitSelect_I4) < 0x123) && (instr->m_src1 != (Opnd *)0x0)) &&
        (bVar4 = IR::Opnd::IsRegOpnd(instr->m_src1), bVar4)) &&
       ((instr->m_src2 == (Opnd *)0x0 &&
        (pSVar16 = IR::Opnd::GetStackSym(instr->m_src1), pSVar16 != (StackSym *)0x0)))) &&
      (((pSVar16->field_5).m_instrDef != (Instr *)0x0 & pSVar16->field_0x18) == 1)) &&
     (((pSVar16->field_5).m_instrDef)->m_opcode == ExtendArg_A)) {
    return opnd;
  }
  this_00 = val->valueInfo;
  local_40 = instr;
  bVar4 = Func::HasFinally(this->func);
  if (((bVar4) && (local_40->m_opcode == ArgOut_A_Inline)) &&
     ((this_00->symStore != (Sym *)0x0 && (this_00->symStore->m_id == 0)))) {
    return opnd;
  }
  bVar4 = ValueInfo::TryGetIntConstantValue(this_00,(int32 *)local_34,false);
  if (!bVar4) {
    bVar4 = ValueInfo::TryGetIntConstantValue(this_00,(int64 *)&aaStack_68[0].bits,false);
    if (!bVar4) {
      bVar4 = IR::Opnd::IsRegOpnd(opnd);
      if (bVar4) {
        pSVar15 = (SymOpnd *)IR::Opnd::AsRegOpnd(opnd);
      }
      else {
        bVar4 = IR::Opnd::IsSymOpnd(opnd);
        if (!bVar4) {
          return opnd;
        }
        pSVar15 = IR::Opnd::AsSymOpnd(opnd);
      }
      local_48 = (StackSym *)pSVar15->m_sym;
      if (local_48 == (StackSym *)0x0) {
        return opnd;
      }
      uVar5 = Func::GetSourceContextId(this->func);
      local_50 = (undefined4 *)CONCAT44(local_50._4_4_,uVar5);
      uVar5 = Func::GetLocalFunctionId(this->func);
      bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_01441eb0,CopyPropPhase,(uint)local_50,uVar5);
      if (!bVar4) {
        pSVar16 = GlobOptBlockData::GetCopyPropSym
                            (&this->currentBlock->globOptData,&local_48->super_Sym,val);
        if (pSVar16 != (StackSym *)0x0) {
          if (((local_48->super_Sym).m_kind == SymKindStack) &&
             (iVar2 = TySize[pSVar16->m_type], pSVar11 = Sym::AsStackSym(&local_48->super_Sym),
             iVar2 != TySize[pSVar11->m_type])) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
            *puVar8 = 1;
            bVar4 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                               ,0xf8d,
                               "(!opndSym->IsStackSym() || copySym->GetSymSize() == opndSym->AsStackSym()->GetSymSize())"
                               ,
                               "!opndSym->IsStackSym() || copySym->GetSymSize() == opndSym->AsStackSym()->GetSymSize()"
                              );
            if (!bVar4) goto LAB_0042c0f6;
            *puVar8 = 0;
          }
          pOVar13 = CopyPropReplaceOpnd(this,local_40,opnd,pSVar16,parentIndirOpnd);
          return pOVar13;
        }
        if ((((this_00->symStore != (Sym *)0x0) && (local_40->m_opcode == Ld_A)) &&
            (bVar4 = IR::Opnd::IsRegOpnd(local_40->m_dst), bVar4)) &&
           (pSVar16 = (StackSym *)this_00->symStore, pRVar14 = IR::Opnd::AsRegOpnd(local_40->m_dst),
           pSVar16 == pRVar14->m_sym)) {
          return opnd;
        }
      }
      SetSymStoreDirect(this,this_00,&local_48->super_Sym);
      return opnd;
    }
    uVar5 = Func::GetSourceContextId(this->func);
    uVar6 = Func::GetLocalFunctionId(this->func);
    bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_01441eb0,ConstPropPhase,uVar5,uVar6);
    if (bVar4) {
      return opnd;
    }
    uVar5 = Func::GetSourceContextId(this->func);
    uVar6 = Func::GetLocalFunctionId(this->func);
    bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_01447bf0,Int64ConstPropPhase,uVar5,uVar6);
    if (!bVar4) {
      return opnd;
    }
    pJVar9 = Func::GetJITFunctionBody(this->func);
    bVar4 = JITTimeFunctionBody::IsWasmFunction(pJVar9);
    if (bVar4) {
LAB_0042b9d4:
      pJVar9 = Func::GetJITFunctionBody(this->func);
      bVar4 = JITTimeFunctionBody::IsWasmFunction(pJVar9);
      if (!bVar4) {
        return opnd;
      }
      bVar4 = IR::Opnd::IsInt64(opnd);
      pIVar20 = local_40;
      if (!bVar4) {
        return opnd;
      }
      this_02 = IR::Int64ConstOpnd::New
                          (CONCAT44(uStack_64,CONCAT22(aaStack_68[1],aaStack_68[0].bits)),
                           opnd->m_type,local_40->m_func);
      uVar5 = Func::GetSourceContextId(this->func);
      uVar6 = Func::GetLocalFunctionId(this->func);
      bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,GlobOptPhase,uVar5,uVar6);
      if (bVar4) {
        Output::Print(L"TRACE ");
        if (this->prePassLoop != (Loop *)0x0) {
          Output::Print(L"[%d, %d]",(ulong)(this->rootLoopPrePass->loopNumber - 1),
                        (ulong)(this->prePassLoop->loopNumber - 1));
        }
        Output::Print(L": ");
        IR::Opnd::Dump(opnd);
        Output::Print(L" : ");
        pIVar20 = local_40;
        iVar10 = IR::Opnd::GetImmediateValue(&this_02->super_Opnd,local_40->m_func);
        Output::Print(L"Constant prop %lld (value:%lld)\n",iVar10,
                      CONCAT44(uStack_64,CONCAT22(aaStack_68[1],aaStack_68[0].bits)));
        Output::Flush();
      }
      CaptureByteCodeSymUses(this,pIVar20);
      pOVar13 = IR::Instr::ReplaceSrc(pIVar20,opnd,&this_02->super_Opnd);
      return pOVar13;
    }
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar8 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0xf69,"(this->func->GetJITFunctionBody()->IsWasmFunction())",
                       "this->func->GetJITFunctionBody()->IsWasmFunction()");
    if (bVar4) {
      *puVar8 = 0;
      goto LAB_0042b9d4;
    }
    goto LAB_0042c0f6;
  }
  uVar5 = Func::GetSourceContextId(this->func);
  uVar6 = Func::GetLocalFunctionId(this->func);
  bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_01441eb0,ConstPropPhase,uVar5,uVar6);
  if (bVar4) {
    return opnd;
  }
  OVar1 = local_40->m_opcode;
  if ((((OVar1 == StElemI_A) || (OVar1 == StElemC)) || (OVar1 == StElemI_A_Strict)) &&
     (local_40->m_src1 == opnd)) {
    pIVar7 = IR::Opnd::AsIndirOpnd(local_40->m_dst);
    aaStack_68[0] = (pIVar7->m_baseOpnd->super_Opnd).m_valueType.field_0;
    bVar4 = ValueType::IsLikelyNativeArray((ValueType *)&aaStack_68[0].field_0);
    if (bVar4) {
      return opnd;
    }
  }
  pIVar20 = local_40;
  if ((local_40->m_src1 != opnd) && (local_40->m_src2 != opnd)) {
    uVar5 = Func::GetSourceContextId(local_40->m_func);
    uVar6 = Func::GetLocalFunctionId(pIVar20->m_func);
    bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_01441eb0,IndirCopyPropPhase,uVar5,uVar6);
    if (bVar4) {
      return opnd;
    }
    uStack_64 = *(undefined4 *)((long)&pIVar20->m_src1 + 4);
    int64ConstantValue._0_4_ = *(undefined4 *)&pIVar20->m_src2;
    int64ConstantValue._4_4_ = *(undefined4 *)((long)&pIVar20->m_src2 + 4);
    aaStack_68[0].bits = (Type)*(undefined4 *)&pIVar20->m_src1;
    aaStack_68[1] = SUB42((uint)*(undefined4 *)&pIVar20->m_src1 >> 0x10,0);
    local_58 = pIVar20->m_dst;
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    local_48 = (StackSym *)&DAT_01453738;
    lVar19 = 0;
    local_50 = puVar8;
    do {
      if (lVar19 == 3) {
        return opnd;
      }
      pOVar13 = *(Opnd **)(aaStack_68 + lVar19 * 4);
      if ((((pOVar13 != (Opnd *)0x0) && (bVar4 = IR::Opnd::IsIndirOpnd(pOVar13), bVar4)) &&
          (pIVar7 = IR::Opnd::AsIndirOpnd(pOVar13),
          (long)(int)local_34[0] + (long)pIVar7->m_offset < 0x80000000)) &&
         (pIVar7->m_indexOpnd == (RegOpnd *)opnd)) {
        if (pIVar7->m_scale != '\0') {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar8 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                             ,0xeed,"(indir->GetScale() == 0)","indir->GetScale() == 0");
          if (!bVar4) goto LAB_0042c0f6;
          *puVar8 = 0;
        }
        uVar5 = Func::GetSourceContextId(this->func);
        uVar6 = Func::GetLocalFunctionId(this->func);
        bVar4 = Js::Phases::IsEnabled((Phases *)local_48,GlobOptPhase,uVar5,uVar6);
        if (bVar4) {
          Output::Print(L"TRACE ");
          if (this->prePassLoop != (Loop *)0x0) {
            Output::Print(L"[%d, %d]",(ulong)(this->rootLoopPrePass->loopNumber - 1),
                          (ulong)(this->prePassLoop->loopNumber - 1));
          }
          Output::Print(L": ");
          IR::Opnd::Dump(opnd);
          Output::Print(L" : ");
          Output::Print(L"Constant prop indir index into offset (value: %d)\n",(ulong)local_34[0]);
          Output::Flush();
        }
        CaptureByteCodeSymUses(this,local_40);
        pIVar7->m_offset = pIVar7->m_offset + local_34[0];
        (pIVar7->super_Opnd).field_0xe = 0;
        IR::IndirOpnd::SetIndexOpnd(pIVar7,(RegOpnd *)0x0);
        puVar8 = local_50;
      }
      lVar19 = lVar19 + 1;
    } while( true );
  }
  IVar17 = opnd->m_type;
  if (IVar17 == TyInt32) {
LAB_0042bddc:
    value = (ulong)local_34[0];
    if (IVar17 != TyUint32) {
      value = (long)(int)local_34[0];
    }
    this_03 = (AddrOpnd *)
              IR::IntConstOpnd::New
                        (value,(IVar17 == TyUint32) * '\x04' + TyInt32,local_40->m_func,false);
    uVar5 = Func::GetSourceContextId(this->func);
    uVar6 = Func::GetLocalFunctionId(this->func);
    bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,GlobOptPhase,uVar5,uVar6);
    if (bVar4) {
      Output::Print(L"TRACE ");
      if (this->prePassLoop != (Loop *)0x0) {
        Output::Print(L"[%d, %d]",(ulong)(this->rootLoopPrePass->loopNumber - 1),
                      (ulong)(this->prePassLoop->loopNumber - 1));
      }
      Output::Print(L": ");
      IR::Opnd::Dump(opnd);
      Output::Print(L" : ");
      pvVar12 = (Var)IR::Opnd::GetImmediateValue((Opnd *)this_03,local_40->m_func);
LAB_0042beb9:
      Output::Print(L"Constant prop %d (value:%d)\n",pvVar12,(ulong)local_34[0]);
      Output::Flush();
    }
  }
  else {
    if (IVar17 != TyVar) {
      bVar4 = IR::Opnd::IsInt64(opnd);
      IVar17 = opnd->m_type;
      if ((!bVar4) && (bVar4 = IVar17 != TyUint32, IVar17 = TyUint32, bVar4)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar8 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                           ,0xf09,"(opnd->IsInt32() || opnd->IsInt64() || opnd->IsUInt32())",
                           "opnd->IsInt32() || opnd->IsInt64() || opnd->IsUInt32()");
        if (!bVar4) goto LAB_0042c0f6;
        *puVar8 = 0;
        IVar17 = opnd->m_type;
      }
      goto LAB_0042bddc;
    }
    this_03 = IR::AddrOpnd::New((Var)((ulong)local_34[0] | 0x1000000000000),AddrOpndKindConstantVar,
                                local_40->m_func,false,(Var)0x0);
    uVar5 = Func::GetSourceContextId(this->func);
    uVar6 = Func::GetLocalFunctionId(this->func);
    bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,GlobOptPhase,uVar5,uVar6);
    if (bVar4) {
      Output::Print(L"TRACE ");
      if (this->prePassLoop != (Loop *)0x0) {
        Output::Print(L"[%d, %d]",(ulong)(this->rootLoopPrePass->loopNumber - 1),
                      (ulong)(this->prePassLoop->loopNumber - 1));
      }
      Output::Print(L": ");
      IR::Opnd::Dump(opnd);
      Output::Print(L" : ");
      pvVar12 = this_03->m_address;
      goto LAB_0042beb9;
    }
  }
  bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_014594b0,FieldCopyPropPhase);
  if (bVar4) {
    IR::Instr::DumpFieldCopyPropTestTrace
              (local_40,SUB41((*(uint *)&this->field_0xf4 & 0x20) >> 5,0));
  }
  pIVar20 = local_40;
  CaptureByteCodeSymUses(this,local_40);
  pOVar13 = IR::Instr::ReplaceSrc(pIVar20,opnd,&this_03->super_Opnd);
  OVar1 = pIVar20->m_opcode;
  uVar18 = OVar1 - 0x59;
  if (uVar18 < 0x34) {
    if ((0x81800002aa020U >> ((ulong)uVar18 & 0x3f) & 1) == 0) {
      if ((ulong)uVar18 != 0) goto LAB_0042bf22;
LAB_0042c04a:
      bVar4 = IR::Opnd::IsRegOpnd(pIVar20->m_dst);
      if (bVar4) {
        pRVar14 = IR::Opnd::AsRegOpnd(local_40->m_dst);
        if ((pRVar14->m_sym->field_0x18 & 1) == 0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar8 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                             ,0xf48,"(instr->GetDst()->AsRegOpnd()->m_sym->m_isSingleDef)",
                             "instr->GetDst()->AsRegOpnd()->m_sym->m_isSingleDef");
          if (!bVar4) {
LAB_0042c0f6:
            pcVar3 = (code *)invalidInstructionException();
            (*pcVar3)();
          }
          *puVar8 = 0;
        }
        pSVar15 = (SymOpnd *)IR::Opnd::AsRegOpnd(local_40->m_dst);
      }
      else {
        pSVar15 = IR::Opnd::AsSymOpnd(local_40->m_dst);
      }
      pSVar16 = Sym::AsStackSym((Sym *)pSVar15->m_sym);
      goto LAB_0042c0e0;
    }
LAB_0042bf84:
    pIVar20->m_opcode = Ld_A;
  }
  else {
LAB_0042bf22:
    uVar18 = OVar1 - 0x1ed;
    if (uVar18 < 0xc) {
      if ((0x23U >> (uVar18 & 0x1f) & 1) != 0) goto LAB_0042c04a;
      if ((0x300U >> (uVar18 & 0x1f) & 1) != 0) goto LAB_0042bf84;
      if (uVar18 == 0xb) {
        if (pIVar20->m_src2 != pOVar13) {
          return pOVar13;
        }
        pIVar20->m_opcode = StSlot;
        IR::Instr::FreeSrc2(pIVar20);
        return (Opnd *)0x0;
      }
    }
    if (OVar1 == TypeofElem) {
      pIVar20->m_opcode = Typeof;
      return pOVar13;
    }
    if (OVar1 != Ld_A) {
      if ((OVar1 != ScopedLdFldForTypeOf) && (OVar1 != LdRootFldForTypeOf)) {
        return pOVar13;
      }
      goto LAB_0042bf84;
    }
  }
  this_01 = pIVar20->m_dst;
  bVar4 = IR::Opnd::IsRegOpnd(this_01);
  if (!bVar4) {
    return pOVar13;
  }
  pRVar14 = IR::Opnd::AsRegOpnd(this_01);
  if ((pRVar14->m_sym->field_0x18 & 1) == 0) {
    return pOVar13;
  }
  if ((pRVar14->m_sym->field_5).m_instrDef == (Instr *)0x0) {
    return pOVar13;
  }
  pRVar14 = IR::Opnd::AsRegOpnd(this_01);
  pSVar16 = pRVar14->m_sym;
LAB_0042c0e0:
  StackSym::SetIsIntConst(pSVar16,(long)(int)local_34[0]);
  return pOVar13;
}

Assistant:

IR::Opnd *
GlobOpt::CopyProp(IR::Opnd *opnd, IR::Instr *instr, Value *val, IR::IndirOpnd *parentIndirOpnd)
{
    Assert(
        parentIndirOpnd
            ? opnd == parentIndirOpnd->GetBaseOpnd() || opnd == parentIndirOpnd->GetIndexOpnd()
            : opnd == instr->GetSrc1() || opnd == instr->GetSrc2() || opnd == instr->GetDst() && opnd->IsIndirOpnd());

    if (this->IsLoopPrePass())
    {
        // Transformations are not legal in prepass...
        return opnd;
    }

    if (instr->m_opcode == Js::OpCode::CheckFixedFld || instr->m_opcode == Js::OpCode::CheckPropertyGuardAndLoadType)
    {
        // Don't copy prop into CheckFixedFld or CheckPropertyGuardAndLoadType
        return opnd;
    }

    // Don't copy-prop link operands of ExtendedArgs
    if (instr->m_opcode == Js::OpCode::ExtendArg_A && opnd == instr->GetSrc2())
    {
        return opnd;
    }

    // Don't copy-prop operand of SIMD instr with ExtendedArg operands. Each instr should have its exclusive EA sequence.
    if (
            Js::IsSimd128Opcode(instr->m_opcode) &&
            instr->GetSrc1() != nullptr &&
            instr->GetSrc1()->IsRegOpnd() &&
            instr->GetSrc2() == nullptr
       )
    {
        StackSym *sym = instr->GetSrc1()->GetStackSym();
        if (sym && sym->IsSingleDef() && sym->GetInstrDef()->m_opcode == Js::OpCode::ExtendArg_A)
        {
                return opnd;
        }
    }

    ValueInfo *valueInfo = val->GetValueInfo();

    if (this->func->HasFinally())
    {
        // s0 = undefined was added on functions with early exit in try-finally functions, that can get copy-proped and case incorrect results
        if (instr->m_opcode == Js::OpCode::ArgOut_A_Inline && valueInfo->GetSymStore() &&
            valueInfo->GetSymStore()->m_id == 0)
        {
            // We don't want to copy-prop s0 (return symbol) into inlinee code
            return opnd;
        }
    }

    // Constant prop?
    int32 intConstantValue;
    int64 int64ConstantValue;
    if (valueInfo->TryGetIntConstantValue(&intConstantValue))
    {
        if (PHASE_OFF(Js::ConstPropPhase, this->func))
        {
            return opnd;
        }

        if ((
                instr->m_opcode == Js::OpCode::StElemI_A ||
                instr->m_opcode == Js::OpCode::StElemI_A_Strict ||
                instr->m_opcode == Js::OpCode::StElemC
            ) && instr->GetSrc1() == opnd)
        {
            // Disabling prop to src of native array store, because we were losing the chance to type specialize.
            // Is it possible to type specialize this src if we allow constants, etc., to be prop'd here?
            if (instr->GetDst()->AsIndirOpnd()->GetBaseOpnd()->GetValueType().IsLikelyNativeArray())
            {
                return opnd;
            }
        }

        if(opnd != instr->GetSrc1() && opnd != instr->GetSrc2())
        {
            if(PHASE_OFF(Js::IndirCopyPropPhase, instr->m_func))
            {
                return opnd;
            }

            // Const-prop an indir opnd's constant index into its offset
            IR::Opnd *srcs[] = { instr->GetSrc1(), instr->GetSrc2(), instr->GetDst() };
            for(int i = 0; i < sizeof(srcs) / sizeof(srcs[0]); ++i)
            {
                const auto src = srcs[i];
                if(!src || !src->IsIndirOpnd())
                {
                    continue;
                }

                const auto indir = src->AsIndirOpnd();
                if ((int64)indir->GetOffset() + intConstantValue > INT32_MAX)
                {
                    continue;
                }
                if(opnd == indir->GetIndexOpnd())
                {
                    Assert(indir->GetScale() == 0);
                    GOPT_TRACE_OPND(opnd, _u("Constant prop indir index into offset (value: %d)\n"), intConstantValue);
                    this->CaptureByteCodeSymUses(instr);
                    indir->SetOffset(indir->GetOffset() + intConstantValue);
                    indir->SetIndexOpnd(nullptr);
                }
            }

            return opnd;
        }

        if (Js::TaggedInt::IsOverflow(intConstantValue))
        {
            return opnd;
        }

        IR::Opnd *constOpnd;

        if (opnd->IsVar())
        {
            IR::AddrOpnd *addrOpnd = IR::AddrOpnd::New(Js::TaggedInt::ToVarUnchecked((int)intConstantValue), IR::AddrOpndKindConstantVar, instr->m_func);

            GOPT_TRACE_OPND(opnd, _u("Constant prop %d (value:%d)\n"), addrOpnd->m_address, intConstantValue);
            constOpnd = addrOpnd;
        }
        else
        {
            // Note: Jit loop body generates some i32 operands...
            Assert(opnd->IsInt32() || opnd->IsInt64() || opnd->IsUInt32());
            IRType opndType;
            IntConstType constVal;
            if (opnd->IsUInt32())
            {
                // avoid sign extension
                constVal = (uint32)intConstantValue;
                opndType = TyUint32;
            }
            else
            {
                constVal = intConstantValue;
                opndType = TyInt32;
            }
            IR::IntConstOpnd *intOpnd = IR::IntConstOpnd::New(constVal, opndType, instr->m_func);

            GOPT_TRACE_OPND(opnd, _u("Constant prop %d (value:%d)\n"), intOpnd->GetImmediateValue(instr->m_func), intConstantValue);
            constOpnd = intOpnd;
        }

#if ENABLE_DEBUG_CONFIG_OPTIONS
        //Need to update DumpFieldCopyPropTestTrace for every new opcode that is added for fieldcopyprop
        if(Js::Configuration::Global.flags.TestTrace.IsEnabled(Js::FieldCopyPropPhase))
        {
            instr->DumpFieldCopyPropTestTrace(this->isRecursiveCallOnLandingPad);
        }
#endif

        this->CaptureByteCodeSymUses(instr);
        opnd = instr->ReplaceSrc(opnd, constOpnd);

        switch (instr->m_opcode)
        {
        case Js::OpCode::LdSlot:
        case Js::OpCode::LdSlotArr:
        case Js::OpCode::LdFld:
        case Js::OpCode::LdFldForTypeOf:
        case Js::OpCode::LdRootFldForTypeOf:
        case Js::OpCode::LdFldForCallApplyTarget:
        case Js::OpCode::LdRootFld:
        case Js::OpCode::LdMethodFld:
        case Js::OpCode::LdRootMethodFld:
        case Js::OpCode::LdMethodFromFlags:
        case Js::OpCode::ScopedLdMethodFld:
        case Js::OpCode::ScopedLdFld:
        case Js::OpCode::ScopedLdFldForTypeOf:
            instr->m_opcode = Js::OpCode::Ld_A;
        case Js::OpCode::Ld_A:
            {
                IR::Opnd * dst = instr->GetDst();
                if (dst->IsRegOpnd() && dst->AsRegOpnd()->m_sym->IsSingleDef())
                {
                    dst->AsRegOpnd()->m_sym->SetIsIntConst((int)intConstantValue);
                }
                break;
            }
        case Js::OpCode::ArgOut_A:
        case Js::OpCode::ArgOut_A_Inline:
        case Js::OpCode::ArgOut_A_FixupForStackArgs:
        case Js::OpCode::ArgOut_A_InlineBuiltIn:

            if (instr->GetDst()->IsRegOpnd())
            {
                Assert(instr->GetDst()->AsRegOpnd()->m_sym->m_isSingleDef);
                instr->GetDst()->AsRegOpnd()->m_sym->AsStackSym()->SetIsIntConst((int)intConstantValue);
            }
            else
            {
                instr->GetDst()->AsSymOpnd()->m_sym->AsStackSym()->SetIsIntConst((int)intConstantValue);
            }
            break;

        case Js::OpCode::TypeofElem:
            instr->m_opcode = Js::OpCode::Typeof;
            break;

        case Js::OpCode::StSlotChkUndecl:
            if (instr->GetSrc2() == opnd)
            {
                // Src2 here should refer to the same location as the Dst operand, which we need to keep live
                // due to the implicit read for ChkUndecl.
                instr->m_opcode = Js::OpCode::StSlot;
                instr->FreeSrc2();
                opnd = nullptr;
            }
            break;
        }
        return opnd;
    }
    else if (valueInfo->TryGetIntConstantValue(&int64ConstantValue, false))
    {
        if (PHASE_OFF(Js::ConstPropPhase, this->func) || !PHASE_ON(Js::Int64ConstPropPhase, this->func))
        {
            return opnd;
        }

        Assert(this->func->GetJITFunctionBody()->IsWasmFunction());
        if (this->func->GetJITFunctionBody()->IsWasmFunction() && opnd->IsInt64())
        {
            IR::Int64ConstOpnd *intOpnd = IR::Int64ConstOpnd::New(int64ConstantValue, opnd->GetType(), instr->m_func);
            GOPT_TRACE_OPND(opnd, _u("Constant prop %lld (value:%lld)\n"), intOpnd->GetImmediateValue(instr->m_func), int64ConstantValue);
            this->CaptureByteCodeSymUses(instr);
            opnd = instr->ReplaceSrc(opnd, intOpnd);
        }
        return opnd;
    }

    Sym *opndSym = nullptr;
    if (opnd->IsRegOpnd())
    {
        IR::RegOpnd *regOpnd = opnd->AsRegOpnd();
        opndSym = regOpnd->m_sym;
    }
    else if (opnd->IsSymOpnd())
    {
        IR::SymOpnd *symOpnd = opnd->AsSymOpnd();
        opndSym = symOpnd->m_sym;
    }
    if (!opndSym)
    {
        return opnd;
    }

    if (PHASE_OFF(Js::CopyPropPhase, this->func))
    {
        this->SetSymStoreDirect(valueInfo, opndSym);
        return opnd;
    }

    StackSym *copySym = CurrentBlockData()->GetCopyPropSym(opndSym, val);
    if (copySym != nullptr)
    {
        Assert(!opndSym->IsStackSym() || copySym->GetSymSize() == opndSym->AsStackSym()->GetSymSize());
        // Copy prop.
        return CopyPropReplaceOpnd(instr, opnd, copySym, parentIndirOpnd);
    }
    else
    {
        if (valueInfo->GetSymStore() && instr->m_opcode == Js::OpCode::Ld_A && instr->GetDst()->IsRegOpnd()
            && valueInfo->GetSymStore() == instr->GetDst()->AsRegOpnd()->m_sym)
        {
            // Avoid resetting symStore after fieldHoisting:
            //  t1 = LdFld field            <- set symStore to fieldHoistSym
            //   fieldHoistSym = Ld_A t1    <- we're looking at t1 now, but want to copy-prop fieldHoistSym forward
            return opnd;
        }
        this->SetSymStoreDirect(valueInfo, opndSym);
    }
    return opnd;
}